

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

void __thiscall deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::render(SRGBTestCase *this)

{
  SRGBTestTexture *pSVar1;
  SRGBTestSampler *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer ppSVar5;
  pointer ppSVar6;
  TestError *this_00;
  ulong uVar7;
  long lVar8;
  long lVar4;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar4 + 0x78))
            (0x8d40,(((this->m_framebuffer).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar4 + 0xd8))(this->m_vaoID);
  (**(code **)(lVar4 + 0x1680))
            (*(undefined4 *)
              ((long)((*(this->m_shaderProgramList).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_program).
                     super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                     m_data.ptr + 0x98));
  if (0 < (int)((ulong)((long)(this->m_textureSourceList).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_textureSourceList).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    uVar7 = 0;
    do {
      (**(code **)(lVar4 + 8))((int)uVar7 + 0x84c0);
      pSVar1 = (this->m_textureSourceList).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7];
      (**(code **)(lVar4 + 0xb8))
                (-(uint)(pSVar1->m_targetType != TEXTURETYPE_2D) | 0xde1,
                 (pSVar1->m_source).m_glTexture);
      iVar3 = (**(code **)(lVar4 + 0xb48))
                        (*(undefined4 *)
                          ((long)((*(this->m_shaderProgramList).
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_program).
                                 super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                 .m_data.ptr + 0x98));
      if (iVar3 == -1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"samplerUniformLocationID != (glw::GLuint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                   ,0x52a);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x14f0))(iVar3,uVar7 & 0xffffffff);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 <
             (long)(int)((ulong)((long)(this->m_textureSourceList).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_textureSourceList).
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  ppSVar5 = (this->m_samplerList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_samplerList).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5) >> 3)) {
    lVar8 = 0;
    do {
      pSVar2 = ppSVar5[lVar8];
      if (pSVar2->m_isActive == true) {
        (*pSVar2->m_gl->bindSampler)(pSVar2->m_textureUnit,pSVar2->m_samplerHandle);
      }
      lVar8 = lVar8 + 1;
      ppSVar5 = (this->m_samplerList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar8 < (int)((ulong)((long)(this->m_samplerList).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5)
                          >> 3));
  }
  (**(code **)(lVar4 + 0x538))(4,0,6);
  ppSVar6 = (this->m_textureSourceList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_textureSourceList).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar6) {
    uVar7 = 0;
    do {
      (**(code **)(lVar4 + 0xb8))(-(uint)(ppSVar6[uVar7]->m_targetType != TEXTURETYPE_2D) | 0xde1,0)
      ;
      uVar7 = uVar7 + 1;
      ppSVar6 = (this->m_textureSourceList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->m_textureSourceList).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6 >> 3))
    ;
  }
  (**(code **)(lVar4 + 0x78))(0x8d40,0);
  (**(code **)(lVar4 + 0xd8))(0);
  (**(code **)(lVar4 + 0x40))(0x8892,0);
  return;
}

Assistant:

void SRGBTestCase::render (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// default rendering only uses one program
	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_framebuffer);
	gl.bindVertexArray(m_vaoID);

	gl.useProgram(m_shaderProgramList[0]->getHandle());

	for (int textureSourceIdx = 0; textureSourceIdx < (int)m_textureSourceList.size(); textureSourceIdx++)
	{
		gl.activeTexture(GL_TEXTURE0 + (glw::GLenum)textureSourceIdx);
		gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), m_textureSourceList[textureSourceIdx]->getHandle());
		glw::GLuint samplerUniformLocationID = gl.getUniformLocation(m_shaderProgramList[0]->getHandle(), m_shaderProgramList[0]->getUniformAtLocation(textureSourceIdx).name.c_str());
		TCU_CHECK(samplerUniformLocationID != (glw::GLuint)-1);
		gl.uniform1i(samplerUniformLocationID, (glw::GLenum)textureSourceIdx);
	}

	for (int samplerIdx = 0; samplerIdx < (int)m_samplerList.size(); samplerIdx++)
	{
		if (m_samplerList[samplerIdx]->getIsActive() == true)
		{
			m_samplerList[samplerIdx]->bindToTexture();
		}
	}

	gl.drawArrays(GL_TRIANGLES, 0, 6);

	for (std::size_t textureSourceIdx = 0; textureSourceIdx < m_textureSourceList.size(); textureSourceIdx++)
	{
		gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), 0);
	}
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
}